

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab9.c
# Opt level: O3

int CheckFromArray(void)

{
  char *__s;
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  char buf2 [128];
  char buf1 [128];
  char local_128 [264];
  
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    uVar2 = 0xffffffff;
    goto LAB_0010356f;
  }
  local_128[0xf0] = '\0';
  local_128[0xf1] = '\0';
  local_128[0xf2] = '\0';
  local_128[0xf3] = '\0';
  local_128[0xf4] = '\0';
  local_128[0xf5] = '\0';
  local_128[0xf6] = '\0';
  local_128[0xf7] = '\0';
  local_128[0xf8] = '\0';
  local_128[0xf9] = '\0';
  local_128[0xfa] = '\0';
  local_128[0xfb] = '\0';
  local_128[0xfc] = '\0';
  local_128[0xfd] = '\0';
  local_128[0xfe] = '\0';
  local_128[0xff] = '\0';
  local_128[0xe0] = '\0';
  local_128[0xe1] = '\0';
  local_128[0xe2] = '\0';
  local_128[0xe3] = '\0';
  local_128[0xe4] = '\0';
  local_128[0xe5] = '\0';
  local_128[0xe6] = '\0';
  local_128[0xe7] = '\0';
  local_128[0xe8] = '\0';
  local_128[0xe9] = '\0';
  local_128[0xea] = '\0';
  local_128[0xeb] = '\0';
  local_128[0xec] = '\0';
  local_128[0xed] = '\0';
  local_128[0xee] = '\0';
  local_128[0xef] = '\0';
  local_128[0xd0] = '\0';
  local_128[0xd1] = '\0';
  local_128[0xd2] = '\0';
  local_128[0xd3] = '\0';
  local_128[0xd4] = '\0';
  local_128[0xd5] = '\0';
  local_128[0xd6] = '\0';
  local_128[0xd7] = '\0';
  local_128[0xd8] = '\0';
  local_128[0xd9] = '\0';
  local_128[0xda] = '\0';
  local_128[0xdb] = '\0';
  local_128[0xdc] = '\0';
  local_128[0xdd] = '\0';
  local_128[0xde] = '\0';
  local_128[0xdf] = '\0';
  local_128[0xc0] = '\0';
  local_128[0xc1] = '\0';
  local_128[0xc2] = '\0';
  local_128[0xc3] = '\0';
  local_128[0xc4] = '\0';
  local_128[0xc5] = '\0';
  local_128[0xc6] = '\0';
  local_128[199] = '\0';
  local_128[200] = '\0';
  local_128[0xc9] = '\0';
  local_128[0xca] = '\0';
  local_128[0xcb] = '\0';
  local_128[0xcc] = '\0';
  local_128[0xcd] = '\0';
  local_128[0xce] = '\0';
  local_128[0xcf] = '\0';
  local_128[0xb0] = '\0';
  local_128[0xb1] = '\0';
  local_128[0xb2] = '\0';
  local_128[0xb3] = '\0';
  local_128[0xb4] = '\0';
  local_128[0xb5] = '\0';
  local_128[0xb6] = '\0';
  local_128[0xb7] = '\0';
  local_128[0xb8] = '\0';
  local_128[0xb9] = '\0';
  local_128[0xba] = '\0';
  local_128[0xbb] = '\0';
  local_128[0xbc] = '\0';
  local_128[0xbd] = '\0';
  local_128[0xbe] = '\0';
  local_128[0xbf] = '\0';
  local_128[0xa0] = '\0';
  local_128[0xa1] = '\0';
  local_128[0xa2] = '\0';
  local_128[0xa3] = '\0';
  local_128[0xa4] = '\0';
  local_128[0xa5] = '\0';
  local_128[0xa6] = '\0';
  local_128[0xa7] = '\0';
  local_128[0xa8] = '\0';
  local_128[0xa9] = '\0';
  local_128[0xaa] = '\0';
  local_128[0xab] = '\0';
  local_128[0xac] = '\0';
  local_128[0xad] = '\0';
  local_128[0xae] = '\0';
  local_128[0xaf] = '\0';
  local_128[0x90] = '\0';
  local_128[0x91] = '\0';
  local_128[0x92] = '\0';
  local_128[0x93] = '\0';
  local_128[0x94] = '\0';
  local_128[0x95] = '\0';
  local_128[0x96] = '\0';
  local_128[0x97] = '\0';
  local_128[0x98] = '\0';
  local_128[0x99] = '\0';
  local_128[0x9a] = '\0';
  local_128[0x9b] = '\0';
  local_128[0x9c] = '\0';
  local_128[0x9d] = '\0';
  local_128[0x9e] = '\0';
  local_128[0x9f] = '\0';
  local_128[0x80] = '\0';
  local_128[0x81] = '\0';
  local_128[0x82] = '\0';
  local_128[0x83] = '\0';
  local_128[0x84] = '\0';
  local_128[0x85] = '\0';
  local_128[0x86] = '\0';
  local_128[0x87] = '\0';
  local_128[0x88] = '\0';
  local_128[0x89] = '\0';
  local_128[0x8a] = '\0';
  local_128[0x8b] = '\0';
  local_128[0x8c] = '\0';
  local_128[0x8d] = '\0';
  local_128[0x8e] = '\0';
  local_128[0x8f] = '\0';
  pcVar3 = ScanChars((FILE *)__stream,0x80,local_128 + 0x80);
  if (pcVar3 == "PASSED") {
    uVar5 = (ulong)testN;
    pcVar3 = testInOut[uVar5].out1;
    sVar4 = strlen(pcVar3);
    iVar1 = strncasecmp(pcVar3,local_128 + 0x80,sVar4);
    pcVar3 = "FAILED";
    if (iVar1 == 0) {
      if ((0x21fUL >> (uVar5 & 0x3f) & 1) == 0) {
        local_128[0x70] = '\0';
        local_128[0x71] = '\0';
        local_128[0x72] = '\0';
        local_128[0x73] = '\0';
        local_128[0x74] = '\0';
        local_128[0x75] = '\0';
        local_128[0x76] = '\0';
        local_128[0x77] = '\0';
        local_128[0x78] = '\0';
        local_128[0x79] = '\0';
        local_128[0x7a] = '\0';
        local_128[0x7b] = '\0';
        local_128[0x7c] = '\0';
        local_128[0x7d] = '\0';
        local_128[0x7e] = '\0';
        local_128[0x7f] = '\0';
        local_128[0x60] = '\0';
        local_128[0x61] = '\0';
        local_128[0x62] = '\0';
        local_128[99] = '\0';
        local_128[100] = '\0';
        local_128[0x65] = '\0';
        local_128[0x66] = '\0';
        local_128[0x67] = '\0';
        local_128[0x68] = '\0';
        local_128[0x69] = '\0';
        local_128[0x6a] = '\0';
        local_128[0x6b] = '\0';
        local_128[0x6c] = '\0';
        local_128[0x6d] = '\0';
        local_128[0x6e] = '\0';
        local_128[0x6f] = '\0';
        local_128[0x50] = '\0';
        local_128[0x51] = '\0';
        local_128[0x52] = '\0';
        local_128[0x53] = '\0';
        local_128[0x54] = '\0';
        local_128[0x55] = '\0';
        local_128[0x56] = '\0';
        local_128[0x57] = '\0';
        local_128[0x58] = '\0';
        local_128[0x59] = '\0';
        local_128[0x5a] = '\0';
        local_128[0x5b] = '\0';
        local_128[0x5c] = '\0';
        local_128[0x5d] = '\0';
        local_128[0x5e] = '\0';
        local_128[0x5f] = '\0';
        local_128[0x40] = '\0';
        local_128[0x41] = '\0';
        local_128[0x42] = '\0';
        local_128[0x43] = '\0';
        local_128[0x44] = '\0';
        local_128[0x45] = '\0';
        local_128[0x46] = '\0';
        local_128[0x47] = '\0';
        local_128[0x48] = '\0';
        local_128[0x49] = '\0';
        local_128[0x4a] = '\0';
        local_128[0x4b] = '\0';
        local_128[0x4c] = '\0';
        local_128[0x4d] = '\0';
        local_128[0x4e] = '\0';
        local_128[0x4f] = '\0';
        local_128[0x30] = '\0';
        local_128[0x31] = '\0';
        local_128[0x32] = '\0';
        local_128[0x33] = '\0';
        local_128[0x34] = '\0';
        local_128[0x35] = '\0';
        local_128[0x36] = '\0';
        local_128[0x37] = '\0';
        local_128[0x38] = '\0';
        local_128[0x39] = '\0';
        local_128[0x3a] = '\0';
        local_128[0x3b] = '\0';
        local_128[0x3c] = '\0';
        local_128[0x3d] = '\0';
        local_128[0x3e] = '\0';
        local_128[0x3f] = '\0';
        local_128[0x20] = '\0';
        local_128[0x21] = '\0';
        local_128[0x22] = '\0';
        local_128[0x23] = '\0';
        local_128[0x24] = '\0';
        local_128[0x25] = '\0';
        local_128[0x26] = '\0';
        local_128[0x27] = '\0';
        local_128[0x28] = '\0';
        local_128[0x29] = '\0';
        local_128[0x2a] = '\0';
        local_128[0x2b] = '\0';
        local_128[0x2c] = '\0';
        local_128[0x2d] = '\0';
        local_128[0x2e] = '\0';
        local_128[0x2f] = '\0';
        local_128[0x10] = '\0';
        local_128[0x11] = '\0';
        local_128[0x12] = '\0';
        local_128[0x13] = '\0';
        local_128[0x14] = '\0';
        local_128[0x15] = '\0';
        local_128[0x16] = '\0';
        local_128[0x17] = '\0';
        local_128[0x18] = '\0';
        local_128[0x19] = '\0';
        local_128[0x1a] = '\0';
        local_128[0x1b] = '\0';
        local_128[0x1c] = '\0';
        local_128[0x1d] = '\0';
        local_128[0x1e] = '\0';
        local_128[0x1f] = '\0';
        local_128[0] = '\0';
        local_128[1] = '\0';
        local_128[2] = '\0';
        local_128[3] = '\0';
        local_128[4] = '\0';
        local_128[5] = '\0';
        local_128[6] = '\0';
        local_128[7] = '\0';
        local_128[8] = '\0';
        local_128[9] = '\0';
        local_128[10] = '\0';
        local_128[0xb] = '\0';
        local_128[0xc] = '\0';
        local_128[0xd] = '\0';
        local_128[0xe] = '\0';
        local_128[0xf] = '\0';
        pcVar3 = ScanChars((FILE *)__stream,0x80,local_128);
        if (pcVar3 == "PASSED") {
          lVar6 = (long)testN;
          pcVar3 = testInOut[lVar6].out2;
          sVar4 = strlen(pcVar3);
          iVar1 = strncasecmp(pcVar3,local_128,sVar4);
          pcVar3 = "PASSED";
          if (iVar1 != 0) {
            __s = testInOut[lVar6].out20;
            if (__s != (char *)0x0) {
              sVar4 = strlen(__s);
              iVar1 = strncasecmp(__s,local_128,sVar4);
              if (iVar1 == 0) goto LAB_0010350f;
            }
            printf("wrong output -- ");
            pcVar3 = "FAILED";
          }
        }
        goto LAB_0010350f;
      }
    }
    else {
LAB_0010350f:
      if (pcVar3 != "PASSED") goto LAB_0010354d;
    }
    iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
    if (iVar1 == 0) {
      pcVar3 = "PASSED";
    }
    else {
      pcVar3 = "FAILED";
    }
  }
LAB_0010354d:
  fclose(__stream);
  puts(pcVar3);
  uVar2 = (uint)(pcVar3 == "FAILED");
LAB_0010356f:
  testN = testN + 1;
  return uVar2;
}

Assistant:

static int CheckFromArray(void)
{
    FILE *const out = fopen("out.txt", "r");
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    const char* fact = Pass;
    char buf1[128] = {0};
    fact = ScanChars(out, sizeof(buf1), buf1);
    if (fact == Pass && _strnicmp(testInOut[testN].out1, buf1, strlen(testInOut[testN].out1)) != 0) {
        fact = Fail;
    }
    if (fact == Pass && testInOut[testN].out2 != NULL) { // check path
        char buf2[128] = {0};
        fact = ScanChars(out, sizeof(buf2), buf2);
        if (fact == Pass && _strnicmp(testInOut[testN].out2, buf2, strlen(testInOut[testN].out2)) != 0) {
            if (testInOut[testN].out20 == NULL || _strnicmp(testInOut[testN].out20, buf2, strlen(testInOut[testN].out20)) != 0) {
                printf("wrong output -- ");
                fact = Fail;
            }
        }
    }
    if (fact == Pass && HaveGarbageAtTheEnd(out)) {
        fact = Fail;
    }
    fclose(out);
    printf("%s\n", fact);
    testN++;
    return fact == Fail;
}